

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

void __thiscall
CaDiCaL::heap<CaDiCaL::score_smaller>::exchange(heap<CaDiCaL::score_smaller> *this,uint a,uint b)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)a;
  if ((ulong)((long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar7) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->pos,uVar7 + 1,&invalid_heap_position);
  }
  puVar3 = (this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)b;
  if ((ulong)((long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= uVar6) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->pos,uVar6 + 1,&invalid_heap_position);
  }
  puVar4 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = puVar5[uVar6];
  uVar2 = puVar4[puVar3[uVar7]];
  puVar4[puVar3[uVar7]] = puVar4[uVar1];
  puVar4[uVar1] = uVar2;
  uVar1 = puVar3[uVar7];
  puVar3[uVar7] = puVar5[uVar6];
  puVar5[uVar6] = uVar1;
  return;
}

Assistant:

void exchange (unsigned a, unsigned b) {
    unsigned &i = index (a), &j = index (b);
    swap (array[i], array[j]);
    swap (i, j);
  }